

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O2

int Am_Fill_To_Rest_Of_Height_proc(Am_Object *self)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  int iVar8;
  Am_Object owner;
  Am_Object part;
  Am_Value_List parts;
  
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)self);
  pAVar7 = Am_Object::Get(&owner,0x82,0);
  Am_Value_List::Am_Value_List(&parts,pAVar7);
  part.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&parts);
  iVar8 = 0;
  while( true ) {
    bVar1 = Am_Value_List::Last(&parts);
    if (bVar1) break;
    pAVar7 = Am_Value_List::Get(&parts);
    Am_Object::operator=(&part,pAVar7);
    bVar1 = Am_Object::operator!=(&part,self);
    if (bVar1) {
      pAVar7 = Am_Object::Get(&part,0x67,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      iVar8 = iVar8 + iVar3;
    }
    Am_Value_List::Next(&parts);
  }
  pAVar7 = Am_Object::Get(&owner,0x67,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&owner,0x9f,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&owner,0xa1,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&owner,0x96,0);
  iVar6 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Value_List::Length(&parts);
  Am_Object::~Am_Object(&part);
  Am_Value_List::~Am_Value_List(&parts);
  Am_Object::~Am_Object(&owner);
  return (iVar3 - (iVar8 + iVar4 + iVar5)) + (1 - (uint)uVar2) * iVar6;
}

Assistant:

Am_Define_Formula(int, Am_Fill_To_Rest_Of_Height)
{
  Am_Object owner = self.Get_Owner();
  Am_Value_List parts = owner.Get(Am_GRAPHICAL_PARTS);
  int height = 0;
  Am_Object part;
  for (parts.Start(); !parts.Last(); parts.Next()) {
    part = parts.Get();
    if (part != self)
      height += (int)part.Get(Am_HEIGHT);
  }
  return (int)owner.Get(Am_HEIGHT) -
         (height + (int)owner.Get(Am_TOP_OFFSET) +
          (int)owner.Get(Am_BOTTOM_OFFSET) +
          (int)owner.Get(Am_V_SPACING) * (parts.Length() - 1));
}